

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy_io.c
# Opt level: O0

void on_underlying_io_bytes_received(void *context,uchar *buffer,size_t size)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  long lVar3;
  uchar *local_a8;
  long local_a0;
  ulong local_98;
  size_t length_remaining;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  char *pcStack_68;
  int status_code;
  char *request_end_ptr;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  uchar *new_receive_buffer;
  size_t realloc_size;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  HTTP_PROXY_IO_INSTANCE *http_proxy_io_instance;
  LOGGER_LOG l;
  size_t size_local;
  uchar *buffer_local;
  void *context_local;
  
  l = (LOGGER_LOG)size;
  size_local = (size_t)buffer;
  buffer_local = (uchar *)context;
  if (context == (void *)0x0) {
    http_proxy_io_instance = (HTTP_PROXY_IO_INSTANCE *)xlogging_get_log_function();
    if (http_proxy_io_instance != (HTTP_PROXY_IO_INSTANCE *)0x0) {
      (*(code *)http_proxy_io_instance)
                (0,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                 ,"on_underlying_io_bytes_received",0x269,1,
                 "NULL context in on_underlying_io_bytes_received");
    }
  }
  else {
    l_1 = (LOGGER_LOG)context;
    switch(*context) {
    case 1:
      realloc_size = (size_t)xlogging_get_log_function();
      if ((LOGGER_LOG)realloc_size != (LOGGER_LOG)0x0) {
        (*(code *)realloc_size)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                   ,"on_underlying_io_bytes_received",0x278,1,
                   "Bytes received while opening underlying IO");
      }
      indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)l_1);
      break;
    case 2:
      if (*(ulong *)((long)context + 0x88) < -size - 1) {
        local_98 = *(long *)((long)context + 0x88) + size;
      }
      else {
        local_98 = 0xffffffffffffffff;
      }
      if (local_98 < 0xfffffffffffffffe) {
        if (*(ulong *)((long)context + 0x88) < -size - 1) {
          local_a0 = *(long *)((long)context + 0x88) + size;
        }
        else {
          local_a0 = -1;
        }
        local_a8 = (uchar *)(local_a0 + 1);
      }
      else {
        local_a8 = (uchar *)0xffffffffffffffff;
      }
      new_receive_buffer = local_a8;
      l_3 = (LOGGER_LOG)0x0;
      if (local_a8 == (uchar *)0xffffffffffffffff) {
        l_4 = xlogging_get_log_function();
        if (l_4 != (LOGGER_LOG)0x0) {
          (*l_4)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                 ,"on_underlying_io_bytes_received",0x285,1,"Invalid memory size for received data")
          ;
        }
        indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)l_1);
      }
      else {
        l_3 = (LOGGER_LOG)realloc(*(void **)((long)context + 0x80),(size_t)local_a8);
        if (l_3 == (LOGGER_LOG)0x0) {
          request_end_ptr = (char *)xlogging_get_log_function();
          if ((LOGGER_LOG)request_end_ptr != (LOGGER_LOG)0x0) {
            (*(code *)request_end_ptr)
                      (AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                       ,"on_underlying_io_bytes_received",0x28b,1,
                       "Cannot allocate memory for received data");
          }
          indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)l_1);
        }
        else {
          *(LOGGER_LOG *)(l_1 + 0x80) = l_3;
          memcpy((void *)(*(long *)(l_1 + 0x80) + *(long *)(l_1 + 0x88)),(void *)size_local,
                 (size_t)l);
          *(LOGGER_LOG *)(l_1 + 0x88) = l + *(long *)(l_1 + 0x88);
        }
      }
      if (((3 < *(ulong *)(l_1 + 0x88)) &&
          (*(undefined1 *)(*(long *)(l_1 + 0x80) + *(long *)(l_1 + 0x88)) = 0,
          3 < *(ulong *)(l_1 + 0x88))) &&
         (pcStack_68 = strstr(*(char **)(l_1 + 0x80),"\r\n\r\n"), pcStack_68 != (char *)0x0)) {
        iVar1 = ParseHttpResponse(*(char **)(l_1 + 0x80),(int *)((long)&l_5 + 4));
        if (iVar1 == 0) {
          if ((l_5._4_4_ < 200) || (299 < l_5._4_4_)) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                        ,"on_underlying_io_bytes_received",0x2b4,1,
                        "Bad status (%d) received in CONNECT response",l_5._4_4_);
            }
            indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)l_1);
          }
          else {
            lVar3 = (*(long *)(l_1 + 0x80) + *(long *)(l_1 + 0x88)) - (long)(pcStack_68 + 4);
            *(undefined4 *)l_1 = 3;
            (**(code **)(l_1 + 0x28))(*(undefined8 *)(l_1 + 0x30),1);
            if (lVar3 != 0) {
              (**(code **)(l_1 + 8))(*(undefined8 *)(l_1 + 0x10),pcStack_68 + 4,lVar3);
            }
          }
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                      ,"on_underlying_io_bytes_received",0x2ac,1,"Cannot decode HTTP response");
          }
          indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)l_1);
        }
      }
      break;
    case 3:
      (**(code **)((long)context + 8))(*(undefined8 *)((long)context + 0x10),buffer,size);
      break;
    default:
      l_2 = xlogging_get_log_function();
      if (l_2 != (LOGGER_LOG)0x0) {
        (*l_2)(AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
               ,"on_underlying_io_bytes_received",0x273,1,"Bytes received in invalid state");
      }
    }
  }
  return;
}

Assistant:

static void on_underlying_io_bytes_received(void* context, const unsigned char* buffer, size_t size)
{
    if (context == NULL)
    {
        /* Codes_SRS_HTTP_PROXY_IO_01_082: [ on_underlying_io_bytes_received called with NULL context shall do nothing. ]*/
        LogError("NULL context in on_underlying_io_bytes_received");
    }
    else
    {
        HTTP_PROXY_IO_INSTANCE* http_proxy_io_instance = (HTTP_PROXY_IO_INSTANCE*)context;

        switch (http_proxy_io_instance->http_proxy_io_state)
        {
        default:
        case HTTP_PROXY_IO_STATE_CLOSING:
            LogError("Bytes received in invalid state");
            break;

        case HTTP_PROXY_IO_STATE_OPENING_UNDERLYING_IO:
            /* Codes_SRS_HTTP_PROXY_IO_01_080: [ If on_underlying_io_bytes_received is called while the underlying IO is being opened, the on_open_complete callback shall be triggered with IO_OPEN_ERROR, passing also the on_open_complete_context argument as context. ]*/
            LogError("Bytes received while opening underlying IO");
            indicate_open_complete_error_and_close(http_proxy_io_instance);
            break;

        case HTTP_PROXY_IO_STATE_WAITING_FOR_CONNECT_RESPONSE:
        {
            /* Codes_SRS_HTTP_PROXY_IO_01_065: [ When bytes are received and the response to the CONNECT request was not yet received, the bytes shall be accumulated until a double new-line is detected. ]*/
            // size_t malloc_size = http_proxy_io_instance->receive_buffer_size + size + 1;
            size_t realloc_size = safe_add_size_t(safe_add_size_t(http_proxy_io_instance->receive_buffer_size, size), 1);

            unsigned char* new_receive_buffer = NULL;
            if (realloc_size == SIZE_MAX)
            {
                LogError("Invalid memory size for received data");
                indicate_open_complete_error_and_close(http_proxy_io_instance);
            }
            else if ((new_receive_buffer = (unsigned char*)realloc(http_proxy_io_instance->receive_buffer, realloc_size)) == NULL)
            {
                /* Codes_SRS_HTTP_PROXY_IO_01_067: [ If allocating memory for the buffered bytes fails, the on_open_complete callback shall be triggered with IO_OPEN_ERROR, passing also the on_open_complete_context argument as context. ]*/
                LogError("Cannot allocate memory for received data");
                indicate_open_complete_error_and_close(http_proxy_io_instance);
            }
            else
            {
                http_proxy_io_instance->receive_buffer = new_receive_buffer;
                memcpy(http_proxy_io_instance->receive_buffer + http_proxy_io_instance->receive_buffer_size, buffer, size);
                http_proxy_io_instance->receive_buffer_size += size;
            }

            if (http_proxy_io_instance->receive_buffer_size >= 4)
            {
                const char* request_end_ptr;

#ifdef _MSC_VER
#pragma warning(disable:6386) // Warning C6386: Buffer overrun while writing to 'http_proxy_io_instance->receive_buffer'
#endif
                http_proxy_io_instance->receive_buffer[http_proxy_io_instance->receive_buffer_size] = 0;
#ifdef _MSC_VER
#pragma warning (default:6386)
#endif
                /* Codes_SRS_HTTP_PROXY_IO_01_066: [ When a double new-line is detected the response shall be parsed in order to extract the status code. ]*/
                if ((http_proxy_io_instance->receive_buffer_size >= 4) &&
                    ((request_end_ptr = strstr((const char*)http_proxy_io_instance->receive_buffer, "\r\n\r\n")) != NULL))
                {
                    int status_code;

                    /* This part should really be done with the HTTPAPI, but that has to be done as a separate step
                    as the HTTPAPI has to expose somehow the underlying IO and currently this would be a too big of a change. */

                    if (ParseHttpResponse((const char*)http_proxy_io_instance->receive_buffer, &status_code) != 0)
                    {
                        /* Codes_SRS_HTTP_PROXY_IO_01_068: [ If parsing the CONNECT response fails, the on_open_complete callback shall be triggered with IO_OPEN_ERROR, passing also the on_open_complete_context argument as context. ]*/
                        LogError("Cannot decode HTTP response");
                        indicate_open_complete_error_and_close(http_proxy_io_instance);
                    }
                    /* Codes_SRS_HTTP_PROXY_IO_01_069: [ Any successful (2xx) response to a CONNECT request indicates that the proxy has established a connection to the requested host and port, and has switched to tunneling the current connection to that server connection. ]*/
                    /* Codes_SRS_HTTP_PROXY_IO_01_090: [ Any successful (2xx) response to a CONNECT request indicates that the proxy has established a connection to the requested host and port, and has switched to tunneling the current connection to that server connection. ]*/
                    else if ((status_code < 200) || (status_code > 299))
                    {
                        /* Codes_SRS_HTTP_PROXY_IO_01_071: [ If the status code is not successful, the on_open_complete callback shall be triggered with IO_OPEN_ERROR, passing also the on_open_complete_context argument as context. ]*/
                        LogError("Bad status (%d) received in CONNECT response", status_code);
                        indicate_open_complete_error_and_close(http_proxy_io_instance);
                    }
                    else
                    {
                        size_t length_remaining = http_proxy_io_instance->receive_buffer + http_proxy_io_instance->receive_buffer_size - ((const unsigned char *)request_end_ptr + 4);

                        /* Codes_SRS_HTTP_PROXY_IO_01_073: [ Once a success status code was parsed, the IO shall be OPEN. ]*/
                        http_proxy_io_instance->http_proxy_io_state = HTTP_PROXY_IO_STATE_OPEN;
                        /* Codes_SRS_HTTP_PROXY_IO_01_070: [ When a success status code is parsed, the on_open_complete callback shall be triggered with IO_OPEN_OK, passing also the on_open_complete_context argument as context. ]*/
                        http_proxy_io_instance->on_io_open_complete(http_proxy_io_instance->on_io_open_complete_context, IO_OPEN_OK);

                        if (length_remaining > 0)
                        {
                            /* Codes_SRS_HTTP_PROXY_IO_01_072: [ Any bytes that are extra (not consumed by the CONNECT response), shall be indicated as received by calling the on_bytes_received callback and passing the on_bytes_received_context as context argument. ]*/
                            http_proxy_io_instance->on_bytes_received(http_proxy_io_instance->on_bytes_received_context, (const unsigned char*)request_end_ptr + 4, length_remaining);
                        }
                    }
                }
            }
            break;
        }
        case HTTP_PROXY_IO_STATE_OPEN:
            /* Codes_SRS_HTTP_PROXY_IO_01_074: [ If on_underlying_io_bytes_received is called while OPEN, all bytes shall be indicated as received by calling the on_bytes_received callback and passing the on_bytes_received_context as context argument. ]*/
            http_proxy_io_instance->on_bytes_received(http_proxy_io_instance->on_bytes_received_context, buffer, size);
            break;
        }
    }
}